

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O2

int __thiscall KMPNativeAffinity::Mask::begin(Mask *this)

{
  int iVar1;
  int retval;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    iVar1 = (*(this->super_Mask)._vptr_Mask[0xb])(this);
    if (iVar1 <= (int)uVar2) {
      return uVar2;
    }
    iVar1 = (*(this->super_Mask)._vptr_Mask[3])(this,(ulong)uVar2);
    if ((char)iVar1 != '\0') break;
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

int begin() const override {
      int retval = 0;
      while (retval < end() && !is_set(retval))
        ++retval;
      return retval;
    }